

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

bool_t beltMACStepV2(octet *mac,size_t mac_len,void *state)

{
  bool_t bVar1;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  belt_mac_st *st;
  
  beltMACStepG_internal(in_RDX);
  bVar1 = memEq(in_RDI,(void *)((long)in_RDX + 0x40),in_RSI);
  return bVar1;
}

Assistant:

bool_t beltMACStepV2(const octet mac[], size_t mac_len, void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(mac_len <= 8);
	ASSERT(memIsValid(mac, mac_len));
	beltMACStepG_internal(st);
#if (OCTET_ORDER == BIG_ENDIAN)
	st->mac[0] = u32Rev(st->mac[0]);
	st->mac[1] = u32Rev(st->mac[1]);
#endif
	return memEq(mac, st->mac, mac_len);
}